

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::expression(Node *__return_storage_ptr__,Parser *this)

{
  vector<Node,_std::allocator<Node>_> *this_00;
  lexemtype lVar1;
  pointer pcVar2;
  undefined8 uVar3;
  Node varNode;
  string local_150;
  undefined1 local_130 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<Node,_std::allocator<Node>_> local_108;
  Node local_f0;
  Node local_b0;
  Node local_70;
  
  lVar1 = (this->lexer).lexem.type;
  test(__return_storage_ptr__,this);
  if (lVar1 == IDENTIFIER) {
    if (__return_storage_ptr__->kind == FUNC_CALL) {
      Lexer::nextLexem(&this->lexer,&this->fin);
      if ((this->lexer).lexem.type != CPAR) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\")\" expected",0xc);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_00107ac4;
      }
      Lexer::nextLexem(&this->lexer,&this->fin);
    }
    if ((this->lexer).lexem.type == EQUAL) {
      if (__return_storage_ptr__->kind == VAR) {
        Lexer::nextLexem(&this->lexer,&this->fin);
        Node::Node(&local_f0,__return_storage_ptr__);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
        Node::Node((Node *)local_130,SET,&local_150);
        uVar3 = local_130._0_8_;
        __return_storage_ptr__->_if = (bool)local_130[4];
        __return_storage_ptr__->_else = (bool)local_130[5];
        local_130._0_4_ = (undefined4)uVar3;
        __return_storage_ptr__->kind = local_130._0_4_;
        std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value);
        this_00 = &__return_storage_ptr__->subnodes;
        std::vector<Node,_std::allocator<Node>_>::operator=(this_00,&local_108);
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._8_8_ != &local_118) {
          operator_delete((void *)local_130._8_8_,local_118._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        Node::Node(&local_70,&local_f0);
        std::vector<Node,_std::allocator<Node>_>::push_back(this_00,&local_70);
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_70.subnodes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
          operator_delete(local_70.value._M_dataplus._M_p,
                          local_70.value.field_2._M_allocated_capacity + 1);
        }
        expression(&local_b0,this);
        std::vector<Node,_std::allocator<Node>_>::push_back(this_00,&local_b0);
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_b0.subnodes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
          operator_delete(local_b0.value._M_dataplus._M_p,
                          local_b0.value.field_2._M_allocated_capacity + 1);
        }
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_f0.subnodes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.value._M_dataplus._M_p != &local_f0.value.field_2) {
          operator_delete(local_f0.value._M_dataplus._M_p,
                          local_f0.value.field_2._M_allocated_capacity + 1);
        }
      }
      else if (__return_storage_ptr__->kind - UN_OP_EXPR_N < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error. Expression is not assignable",0x23);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00107ac4:
        exit(0);
      }
    }
    if ((this->lexer).lexem.type == INTLITERAL) {
      pcVar2 = (this->lexer).lexem.value._M_dataplus._M_p;
      local_130._0_8_ = local_130 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_130,pcVar2,pcVar2 + (this->lexer).lexem.value._M_string_length);
      Node::Node(&local_f0,CONST,(string *)local_130);
      __return_storage_ptr__->_if = local_f0._if;
      __return_storage_ptr__->_else = local_f0._else;
      __return_storage_ptr__->kind = local_f0.kind;
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value);
      std::vector<Node,_std::allocator<Node>_>::operator=
                (&__return_storage_ptr__->subnodes,&local_f0.subnodes);
      std::vector<Node,_std::allocator<Node>_>::~vector(&local_f0.subnodes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.value._M_dataplus._M_p != &local_f0.value.field_2) {
        operator_delete(local_f0.value._M_dataplus._M_p,
                        local_f0.value.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
      }
      Lexer::nextLexem(&this->lexer,&this->fin);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::expression() {
    if (getLexemType() != IDENTIFIER) {
        return test();
    }
    Node expNode = test();
    if (expNode.getKind() == FUNC_CALL) {
        nextLexem();
        if (getLexemType() != CPAR) {
            cout << "\")\" expected" << endl;
            exit(0);
        }
        nextLexem();
    }
    if (getLexemType() == EQUAL) {
        if (expNode.getKind() == UN_OP_EXPR_L_N || expNode.getKind() == UN_OP_EXPR_N) {
            cout << "Error. Expression is not assignable" << endl;
            exit(0);
        }
        if (expNode.getKind() == VAR) {
            nextLexem();
            Node varNode = Node(expNode);
            expNode = Node(SET);
            expNode.addSubnode(varNode);
            expNode.addSubnode(expression());
        }
    }
    if (getLexemType() == INTLITERAL) {
        expNode = Node(CONST, getLexemValue());
        nextLexem();
    }
    return expNode;
}